

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<Job,_std::shared_ptr<Job>_> * __thiscall
pybind11::class_<Job,std::shared_ptr<Job>>::def_property<std::__cxx11::string(Job::*)()const>
          (class_<Job,std::shared_ptr<Job>> *this,char *name,offset_in_Job_to_subr *fget,
          cpp_function *fset)

{
  class_<Job,_std::shared_ptr<Job>_> *pcVar1;
  return_value_policy local_31;
  cpp_function local_30;
  is_method local_28;
  
  cpp_function::cpp_function<std::__cxx11::string,Job>(&local_30,*fget);
  local_31 = reference_internal;
  local_28.class_.m_ptr = *(handle *)this;
  pcVar1 = def_property_static<pybind11::is_method,pybind11::return_value_policy>
                     (this,name,&local_30,fset,&local_28,&local_31);
  object::~object((object *)&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(fget), fset, return_value_policy::reference_internal, extra...);
    }